

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Off_reader.h
# Opt level: O0

bool __thiscall
Gudhi::Off_reader::
read<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
          (Off_reader *this,
          Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
          *off_visitor)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_31;
  bool success_read_off_faces;
  bool success_read_off_points;
  bool success_read_off_preamble;
  Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  *off_visitor_local;
  Off_reader *this_local;
  
  bVar1 = read_off_preamble<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
                    (this,off_visitor);
  if (bVar1) {
    bVar2 = read_off_points<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
                      (this,off_visitor);
    if (bVar2) {
      bVar3 = read_off_faces<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
                        (this,off_visitor);
      if (bVar3) {
        skeleton_blocker::
        Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
        ::done(off_visitor);
        local_31 = false;
        if ((bVar1) && (local_31 = false, bVar2)) {
          local_31 = bVar3;
        }
        this_local._7_1_ = local_31;
      }
      else {
        std::operator<<((ostream *)&std::cerr,"could not read off faces\n");
        this_local._7_1_ = false;
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"could not read off points\n");
      this_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"could not read off preambule\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool read(OffVisitor& off_visitor) {
    bool success_read_off_preamble = read_off_preamble(off_visitor);
    if (!success_read_off_preamble) {
      std::cerr << "could not read off preambule\n";
      return false;
    }

    bool success_read_off_points = read_off_points(off_visitor);
    if (!success_read_off_points) {
      std::cerr << "could not read off points\n";
      return false;
    }

    bool success_read_off_faces = read_off_faces(off_visitor);
    if (!success_read_off_faces) {
      std::cerr << "could not read off faces\n";
      return false;
    }

    off_visitor.done();
    return success_read_off_preamble && success_read_off_points && success_read_off_faces;
  }